

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadVerilog(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_40;
  int c;
  int fBarBufs;
  int fCheck;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = 1;
  local_40 = 0;
  glo_fMapped = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"mcbh"), iVar1 != -1) {
    switch(iVar1) {
    case 0x62:
      local_40 = local_40 ^ 1;
      break;
    case 99:
      c = c ^ 1;
      break;
    default:
      goto LAB_0039d7f0;
    case 0x68:
      goto LAB_0039d7f0;
    case 0x6d:
      glo_fMapped = glo_fMapped ^ 1;
    }
  }
  if (argc == globalUtilOptind + 1) {
    pNtk_00 = Io_Read(argv[globalUtilOptind],IO_FILE_VERILOG,c,local_40);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
      Abc_FrameClearVerifStatus(pAbc);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_0039d7f0:
    fprintf((FILE *)pAbc->Err,"usage: read_verilog [-mcbh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads the network in Verilog (IWLS 2002/2005 subset)\n");
    pcVar2 = "no";
    if (glo_fMapped != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (c != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar2);
    pcVar2 = "no";
    if (local_40 != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-b     : toggle reading barrier buffers [default = %s]\n",pcVar2);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadVerilog( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fCheck, fBarBufs;
    int c;

    fCheck = 1;
    fBarBufs = 0;
    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mcbh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'b':
                fBarBufs ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, IO_FILE_VERILOG, fCheck, fBarBufs );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_verilog [-mcbh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in Verilog (IWLS 2002/2005 subset)\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle reading barrier buffers [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}